

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *pack_context_opaque)

{
  unsigned_short uVar1;
  stbrp_coord sVar2;
  ushort uVar3;
  int iVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  bool bVar7;
  int local_4c;
  int local_48;
  int i_1;
  int i;
  undefined1 local_38 [8];
  ImVector<stbrp_rect> pack_rects;
  ImVector<ImFontAtlas::CustomRect> *user_rects;
  stbrp_context *pack_context;
  void *pack_context_opaque_local;
  ImFontAtlas *atlas_local;
  
  pack_rects.Data = (stbrp_rect *)&atlas->CustomRects;
  if (((ImVector<ImFontAtlas::CustomRect> *)pack_rects.Data)->Size < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x78d,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  ImVector<stbrp_rect>::ImVector((ImVector<stbrp_rect> *)local_38);
  ImVector<stbrp_rect>::resize((ImVector<stbrp_rect> *)local_38,(pack_rects.Data)->id);
  memset((void *)pack_rects._0_8_,0,(long)(pack_rects.Data)->id << 4);
  for (local_48 = 0; local_48 < (pack_rects.Data)->id; local_48 = local_48 + 1) {
    pvVar5 = ImVector<ImFontAtlas::CustomRect>::operator[]
                       ((ImVector<ImFontAtlas::CustomRect> *)pack_rects.Data,local_48);
    uVar1 = pvVar5->Width;
    pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_48);
    pvVar6->w = uVar1;
    pvVar5 = ImVector<ImFontAtlas::CustomRect>::operator[]
                       ((ImVector<ImFontAtlas::CustomRect> *)pack_rects.Data,local_48);
    uVar1 = pvVar5->Height;
    pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_48);
    pvVar6->h = uVar1;
  }
  pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,0);
  stbrp_pack_rects((stbrp_context *)pack_context_opaque,pvVar6,local_38._0_4_);
  local_4c = 0;
  do {
    if ((int)local_38._0_4_ <= local_4c) {
      ImVector<stbrp_rect>::~ImVector((ImVector<stbrp_rect> *)local_38);
      return;
    }
    pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
    if (pvVar6->was_packed != 0) {
      pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
      sVar2 = pvVar6->x;
      pvVar5 = ImVector<ImFontAtlas::CustomRect>::operator[]
                         ((ImVector<ImFontAtlas::CustomRect> *)pack_rects.Data,local_4c);
      pvVar5->X = sVar2;
      pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
      sVar2 = pvVar6->y;
      pvVar5 = ImVector<ImFontAtlas::CustomRect>::operator[]
                         ((ImVector<ImFontAtlas::CustomRect> *)pack_rects.Data,local_4c);
      pvVar5->Y = sVar2;
      pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
      sVar2 = pvVar6->w;
      pvVar5 = ImVector<ImFontAtlas::CustomRect>::operator[]
                         ((ImVector<ImFontAtlas::CustomRect> *)pack_rects.Data,local_4c);
      bVar7 = false;
      if (sVar2 == pvVar5->Width) {
        pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
        sVar2 = pvVar6->h;
        pvVar5 = ImVector<ImFontAtlas::CustomRect>::operator[]
                           ((ImVector<ImFontAtlas::CustomRect> *)pack_rects.Data,local_4c);
        bVar7 = sVar2 == pvVar5->Height;
      }
      if (!bVar7) {
        __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                      ,0x79d,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
      }
      iVar4 = atlas->TexHeight;
      pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
      uVar3 = pvVar6->y;
      pvVar6 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_38,local_4c);
      iVar4 = ImMax<int>(iVar4,(uint)uVar3 + (uint)pvVar6->h);
      atlas->TexHeight = iVar4;
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* pack_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)pack_context_opaque;

    ImVector<ImFontAtlas::CustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, sizeof(stbrp_rect) * user_rects.Size);
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}